

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteSwitch<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  VectorType VVar1;
  VectorType VVar2;
  
  VVar1 = left->vector_type;
  VVar2 = right->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    ExecuteConstant<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool>
              (left,right,result,fun);
    return;
  }
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
    ExecuteFlat<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool,false,true>
              (left,right,result,count,fun);
    return;
  }
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
    ExecuteFlat<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool,true,false>
              (left,right,result,count,fun);
    return;
  }
  if (VVar2 != FLAT_VECTOR || VVar1 != FLAT_VECTOR) {
    ExecuteGeneric<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool>
              (left,right,result,count,fun);
    return;
  }
  ExecuteFlat<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool,false,false>
            (left,right,result,count,fun);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}